

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCodeTarget(Parse *pParse,Expr *pExpr,int target)

{
  byte bVar1;
  u8 uVar2;
  Table *pTVar3;
  AggInfo *pAVar4;
  bool bVar5;
  u16 uVar6;
  undefined4 uVar7;
  Parse *pPVar8;
  char cVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  char *z2;
  FuncDef *pDef;
  Parse *pPVar15;
  char *pcVar16;
  ExprList_item *pEVar17;
  Expr *pEVar18;
  CollSeq *zP4;
  long lVar19;
  char *pcVar20;
  int iVar21;
  Expr *pEVar22;
  Parse *pPVar23;
  ulong uVar24;
  ulong uVar25;
  int regFree2;
  int local_104;
  Parse *local_100;
  Expr *local_f8;
  ulong local_f0;
  ulong local_e8;
  Parse *local_e0;
  Expr *local_d8;
  sqlite3 *local_d0;
  Expr *local_c8;
  Expr opCompare;
  Expr cacheX;
  
  bVar10 = 0;
  pPVar15 = (Parse *)pParse->pVdbe;
  local_104 = 0;
  regFree2 = 0;
  if (pPVar15 == (Parse *)0x0) {
    return 0;
  }
  iVar12 = target;
  if (pExpr == (Expr *)0x0) {
switchD_00168181_caseD_62:
    iVar21 = 0;
    uVar14 = 10;
    goto LAB_001681c3;
  }
  bVar1 = pExpr->op;
  uVar13 = (uint)bVar1;
  uVar14 = (uint)bVar1;
  local_100 = pParse;
  iVar11 = target;
  local_e0 = pPVar15;
  switch(bVar1) {
  case 0x13:
  case 0x5d:
    iVar21 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&local_104);
    uVar14 = uVar13;
    goto LAB_001681c3;
  case 0x14:
switchD_00168181_caseD_14:
    target = sqlite3CodeSubselect(pParse,pExpr,0,0);
    break;
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x51:
  case 0x5f:
  case 0x60:
  case 0x61:
    goto switchD_00168181_caseD_15;
  case 0x18:
  case 0x5c:
switchD_00168181_caseD_18:
    target = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
    break;
  case 0x25:
    iVar12 = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
    cVar9 = sqlite3AffinityType((pExpr->u).zToken);
    if (iVar12 != target) {
      sqlite3VdbeAddOp3((Vdbe *)pPVar15,0xf,iVar12,target,0);
    }
    sqlite3VdbeAddOp3((Vdbe *)pPVar15,cVar9 + 0x2c,target,0,0);
    sqlite3ExprCacheRemove(pParse,target,1);
    break;
  case 0x38:
    if (pParse->pTriggerTab == (Table *)0x0) {
      sqlite3ErrorMsg(pParse,"RAISE() may only be used within a trigger-program");
      return 0;
    }
    cVar9 = pExpr->affinity;
    if (cVar9 != '\x04') {
      if (cVar9 == '\x02') {
        pPVar15 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar15 = pParse;
        }
        pPVar15->mayAbort = '\x01';
      }
      sqlite3HaltConstraint(pParse,0x713,(int)cVar9,(pExpr->u).zToken,0);
      break;
    }
    pcVar16 = (pExpr->u).zToken;
    iVar11 = 6;
    iVar12 = 4;
    goto LAB_001686a8;
  case 0x3c:
    pTVar3 = pExpr->pTab;
    sqlite3VdbeAddOp3((Vdbe *)pPVar15,0x74,
                      (int)pExpr->iColumn + (pTVar3->nCol + 1) * pExpr->iTable + 1,target,0);
    if (((long)pExpr->iColumn < 0) || (pTVar3->aCol[pExpr->iColumn].affinity != 'e')) break;
    iVar21 = target;
    uVar14 = 0x16;
    iVar12 = 0;
LAB_001681c3:
    iVar11 = 0;
LAB_001681c6:
    sqlite3VdbeAddOp3((Vdbe *)pPVar15,uVar14,iVar21,iVar12,iVar11);
    break;
  case 0x44:
  case 0x45:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
    iVar12 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&local_104);
    iVar21 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    goto LAB_001681c6;
  case 0x46:
switchD_00168181_caseD_46:
    iVar12 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&local_104);
    iVar11 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    uVar13 = (bVar1 == 0x46) + 0x4b;
    pEVar18 = pExpr->pLeft;
    pEVar22 = pExpr->pRight;
    iVar21 = 0x90;
    goto LAB_001683fb;
  case 0x47:
    local_100 = (Parse *)pExpr->pLeft;
    pEVar17 = ((pExpr->x).pList)->a;
    pEVar18 = pEVar17->pExpr;
    iVar12 = sqlite3ExprCodeTemp(pParse,(Expr *)local_100,&local_104);
    local_f8 = (Expr *)CONCAT44(local_f8._4_4_,iVar12);
    iVar12 = sqlite3ExprCodeTemp(pParse,pEVar18,&regFree2);
    uVar2 = pParse->nTempReg;
    if (uVar2 == '\0') {
      iVar11 = pParse->nMem + 1;
      pParse->nMem = iVar11;
LAB_00168bad:
      iVar21 = pParse->nMem + 1;
      pParse->nMem = iVar21;
    }
    else {
      bVar10 = uVar2 - 1;
      pParse->nTempReg = bVar10;
      iVar11 = pParse->aTempReg[bVar10];
      if (bVar10 == 0) goto LAB_00168bad;
      pParse->nTempReg = uVar2 - 2;
      iVar21 = pParse->aTempReg[(byte)(uVar2 - 2)];
    }
    codeCompare(pParse,(Expr *)local_100,pEVar18,0x50,(uint)local_f8,iVar12,iVar11,0x10);
    pPVar15 = local_e0;
    pEVar18 = pEVar17[1].pExpr;
    if (regFree2 != 0) {
      bVar10 = pParse->nTempReg;
      if ((ulong)bVar10 < 8) {
        lVar19 = 0;
        do {
          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar19) == regFree2) {
            (&pParse->aColCache[0].tempReg)[lVar19] = '\x01';
            goto LAB_00168ca8;
          }
          lVar19 = lVar19 + 0x18;
        } while ((int)lVar19 != 0xf0);
        pParse->nTempReg = bVar10 + 1;
        pParse->aTempReg[bVar10] = regFree2;
      }
    }
LAB_00168ca8:
    iVar12 = sqlite3ExprCodeTemp(pParse,pEVar18,&regFree2);
    codeCompare(pParse,(Expr *)local_100,pEVar18,0x4e,(uint)local_f8,iVar12,iVar21,0x10);
    sqlite3VdbeAddOp3((Vdbe *)pPVar15,0x45,iVar11,iVar21,target);
    if (iVar11 != 0) {
      bVar10 = pParse->nTempReg;
      if ((ulong)bVar10 < 8) {
        lVar19 = 0;
        do {
          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar19) == iVar11) {
            (&pParse->aColCache[0].tempReg)[lVar19] = '\x01';
            goto LAB_00168d2a;
          }
          lVar19 = lVar19 + 0x18;
        } while ((int)lVar19 != 0xf0);
        pParse->nTempReg = bVar10 + 1;
        pParse->aTempReg[bVar10] = iVar11;
      }
    }
LAB_00168d2a:
    if (iVar21 != 0) {
      bVar10 = pParse->nTempReg;
      if ((ulong)bVar10 < 8) {
        lVar19 = 0;
        do {
          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar19) == iVar21) {
            (&pParse->aColCache[0].tempReg)[lVar19] = '\x01';
            goto LAB_001681cf;
          }
          lVar19 = lVar19 + 0x18;
        } while ((int)lVar19 != 0xf0);
        pParse->nTempReg = bVar10 + 1;
        pParse->aTempReg[bVar10] = iVar21;
      }
    }
    break;
  case 0x48:
    uVar13 = sqlite3VdbeMakeLabel((Vdbe *)pPVar15);
    uVar14 = sqlite3VdbeMakeLabel((Vdbe *)pPVar15);
    sqlite3VdbeAddOp3((Vdbe *)pPVar15,10,0,target,0);
    sqlite3ExprCodeIN(pParse,pExpr,uVar13,uVar14);
    sqlite3VdbeAddOp3((Vdbe *)pPVar15,7,1,target,0);
    if (*(long *)(pPVar15->aTempReg + 6) != 0) {
      *(int *)(*(long *)(pPVar15->aTempReg + 6) + (long)(int)~uVar13 * 4) = pPVar15->aTempReg[3];
    }
    sqlite3VdbeAddOp3((Vdbe *)pPVar15,0x14,target,0,0);
    lVar19 = *(long *)(pPVar15->aTempReg + 6);
    if (lVar19 == 0) break;
    iVar12 = pPVar15->aTempReg[3];
    goto LAB_00168b73;
  case 0x49:
  case 0x4a:
    sqlite3VdbeAddOp3((Vdbe *)pPVar15,7,1,target,0);
    iVar12 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&local_104);
    uVar14 = sqlite3VdbeAddOp3((Vdbe *)pPVar15,(uint)bVar1,iVar12,0,0);
    sqlite3VdbeAddOp3((Vdbe *)pPVar15,0x14,target,-1,0);
    if ((-1 < (int)uVar14) && (uVar14 < (uint)pPVar15->aTempReg[3])) {
      *(int *)(pPVar15->zErrMsg + (ulong)uVar14 * 0x18 + 8) = pPVar15->aTempReg[3];
    }
    break;
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
    iVar12 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&local_104);
    iVar11 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    pEVar18 = pExpr->pLeft;
    pEVar22 = pExpr->pRight;
    iVar21 = 0x10;
LAB_001683fb:
    codeCompare(pParse,pEVar18,pEVar22,uVar13,iVar12,iVar11,target,iVar21);
    break;
  case 0x5e:
    pcVar16 = (pExpr->u).zToken;
    iVar11 = 0x5e;
LAB_001686a8:
    iVar12 = sqlite3VdbeAddOp3((Vdbe *)pPVar15,iVar11,0,iVar12,0);
    iVar11 = 0;
LAB_001688b4:
    sqlite3VdbeChangeP4((Vdbe *)pPVar15,iVar12,pcVar16,iVar11);
    break;
  case 0x62:
    goto switchD_00168181_caseD_62;
  default:
    switch(bVar1) {
    case 0x81:
      iVar12 = 0;
      goto LAB_00168966;
    case 0x82:
      pcVar16 = (pExpr->u).zToken;
      iVar12 = 0;
LAB_00168c59:
      codeReal((Vdbe *)pPVar15,pcVar16,iVar12,target);
      break;
    case 0x83:
      uVar14 = 0xffffffff;
      pcVar16 = (pExpr->u).zToken + 2;
      do {
        uVar14 = uVar14 + 1;
        cVar9 = *pcVar16;
        pcVar16 = pcVar16 + 1;
      } while (cVar9 != '\0');
      iVar12 = (uVar14 & 0x3fffffff) - 1;
      pcVar16 = (char *)sqlite3HexToBlob(pPVar15->db,(pExpr->u).zToken + 2,iVar12);
      iVar12 = sqlite3VdbeAddOp3((Vdbe *)pPVar15,0xb,
                                 (int)(((uVar14 & 0x3fffffff) - (iVar12 >> 0x1f)) + -1) >> 1,target,
                                 0);
      iVar11 = -1;
      goto LAB_001688b4;
    case 0x84:
      target = pExpr->iTable;
      break;
    case 0x85:
      sqlite3VdbeAddOp3((Vdbe *)pPVar15,0xc,(int)pExpr->iColumn,target,0);
      if ((pExpr->u).zToken[1] == '\0') break;
      pcVar16 = pParse->azVar[(long)pExpr->iColumn + -1];
      iVar12 = -1;
      iVar11 = -2;
      goto LAB_001688b4;
    case 0x92:
      goto switchD_00168181_caseD_46;
    case 0x97:
    case 0x9b:
      local_d0 = pParse->db;
      uVar14 = 0;
      bVar5 = true;
      if (((pExpr->flags & 0x4000) == 0) &&
         (local_100 = (Parse *)(pExpr->x).pList, local_100 != (Parse *)0x0)) {
        local_f0 = (ulong)(uint)((ExprList *)local_100)->nExpr;
        bVar5 = false;
      }
      else {
        local_100 = (Parse *)0x0;
        local_f0 = 0;
      }
      pcVar16 = (pExpr->u).zToken;
      if (pcVar16 != (char *)0x0) {
        uVar14 = 0xffffffff;
        pcVar20 = pcVar16;
        do {
          uVar14 = uVar14 + 1;
          cVar9 = *pcVar20;
          pcVar20 = pcVar20 + 1;
        } while (cVar9 != '\0');
        uVar14 = uVar14 & 0x3fffffff;
      }
      local_e8 = (ulong)(uint)target;
      pDef = sqlite3FindFunction(local_d0,pcVar16,uVar14,(int)local_f0,local_d0->aDb->pSchema->enc,
                                 '\0');
      uVar24 = local_f0;
      pPVar8 = local_100;
      if (pDef == (FuncDef *)0x0) {
        sqlite3ErrorMsg(pParse,"unknown function: %.*s()",(ulong)uVar14);
      }
      else {
        bVar10 = pDef->flags;
        if ((bVar10 & 0x20) == 0) {
          local_d8 = (Expr *)0x0;
          iVar12 = (int)local_f0;
          if (!bVar5) {
            if (pParse->nRangeReg < iVar12) {
              uVar14 = pParse->nMem + 1;
              pParse->nMem = pParse->nMem + iVar12;
            }
            else {
              uVar14 = pParse->iRangeReg;
              pParse->iRangeReg = uVar14 + iVar12;
              pParse->nRangeReg = pParse->nRangeReg - iVar12;
            }
            local_d8 = (Expr *)(ulong)uVar14;
            if ((0x3f < bVar10) &&
               (pEVar18 = ((ExprList_item *)local_100->zErrMsg)->pExpr, (pEVar18->op & 0xfd) == 0x98
               )) {
              pEVar18->op2 = bVar10;
            }
            pParse->iCacheLevel = pParse->iCacheLevel + 1;
            pPVar23 = local_100;
            sqlite3ExprCodeExprList(pParse,(ExprList *)local_100,uVar14,1);
            sqlite3ExprCachePop(pParse,(int)pPVar23);
          }
          if (iVar12 < 2) {
            target = (int)local_e8;
            if (iVar12 == 1) goto LAB_00168deb;
            local_e0._0_4_ = 0;
            iVar11 = (int)local_d8;
            local_f8 = (Expr *)pDef;
            if ((pDef->flags & 8) != 0) goto LAB_00168f00;
          }
          else {
            if ((pExpr->flags & 0x80) == 0) {
LAB_00168deb:
              pEVar17 = (ExprList_item *)pPVar8->zErrMsg;
            }
            else {
              pEVar17 = (ExprList_item *)pPVar8->zErrMsg + 1;
            }
            pEVar18 = (Expr *)sqlite3VtabOverloadFunction(local_d0,pDef,iVar12,pEVar17->pExpr);
            lVar19 = 0;
            uVar25 = 0;
            local_e0._0_4_ = 0;
            zP4 = (CollSeq *)0x0;
            local_f8 = pEVar18;
            do {
              if (uVar25 < 0x20) {
                opCompare.pLeft = (Expr *)0x0;
                opCompare.pRight = (Expr *)0x0;
                opCompare.x = (anon_union_8_2_a01b6dbf_for_x)0x1;
                opCompare._0_8_ = exprNodeIsConstant;
                opCompare.u.zToken = (char *)selectNodeIsConstant;
                sqlite3WalkExpr((Walker *)&opCompare,
                                *(Expr **)((long)&((ExprList_item *)local_100->zErrMsg)->pExpr +
                                          lVar19));
                pEVar18 = local_f8;
                if (opCompare.x._0_4_ != 0) {
                  local_e0._0_4_ = (uint)local_e0 | 1 << ((uint)uVar25 & 0x1f);
                }
              }
              if (((((FuncDef *)pEVar18)->flags & 8) != 0) && (zP4 == (CollSeq *)0x0)) {
                zP4 = sqlite3ExprCollSeq(pParse,*(Expr **)((long)&((ExprList_item *)
                                                                  local_100->zErrMsg)->pExpr +
                                                          lVar19));
                pEVar18 = local_f8;
              }
              uVar25 = uVar25 + 1;
              lVar19 = lVar19 + 0x20;
            } while ((uVar24 & 0xffffffff) != uVar25);
            target = (int)local_e8;
            iVar12 = (int)local_f0;
            iVar11 = (int)local_d8;
            if ((((FuncDef *)pEVar18)->flags & 8) != 0) {
              if (zP4 == (CollSeq *)0x0) {
LAB_00168f00:
                zP4 = local_d0->pDfltColl;
              }
              iVar21 = sqlite3VdbeAddOp3((Vdbe *)pPVar15,0x11,0,0,0);
              sqlite3VdbeChangeP4((Vdbe *)pPVar15,iVar21,(char *)zP4,-4);
            }
          }
          iVar21 = sqlite3VdbeAddOp3((Vdbe *)pPVar15,0x12,(uint)local_e0,iVar11,target);
          sqlite3VdbeChangeP4((Vdbe *)pPVar15,iVar21,(char *)local_f8,-5);
          if (pPVar15->zErrMsg != (char *)0x0) {
            pPVar15->zErrMsg[(long)pPVar15->aTempReg[3] * 0x18 + -0x15] = (char)iVar12;
          }
          if ((iVar12 != 0) &&
             (sqlite3ExprCacheRemove(pParse,iVar11,iVar12), pParse->nRangeReg < iVar12)) {
            pParse->nRangeReg = iVar12;
            pParse->iRangeReg = iVar11;
          }
          break;
        }
        iVar12 = sqlite3VdbeMakeLabel((Vdbe *)pPVar15);
        pPVar8 = local_100;
        local_f8 = (Expr *)CONCAT44(local_f8._4_4_,iVar12);
        iVar12 = (int)local_e8;
        sqlite3ExprCode(pParse,((ExprList_item *)local_100->zErrMsg)->pExpr,iVar12);
        if (1 < (int)local_f0) {
          uVar24 = local_f0 & 0xffffffff;
          lVar19 = 0x20;
          do {
            sqlite3VdbeAddOp3((Vdbe *)pPVar15,0x4a,iVar12,(uint)local_f8,0);
            sqlite3ExprCacheRemove(pParse,iVar12,1);
            pParse->iCacheLevel = pParse->iCacheLevel + 1;
            pEVar18 = *(Expr **)((long)&((ExprList_item *)pPVar8->zErrMsg)->pExpr + lVar19);
            sqlite3ExprCode(pParse,pEVar18,iVar12);
            sqlite3ExprCachePop(pParse,(int)pEVar18);
            lVar19 = lVar19 + 0x20;
          } while (uVar24 << 5 != lVar19);
        }
        if (*(long *)(pPVar15->aTempReg + 6) != 0) {
          *(int *)(*(long *)(pPVar15->aTempReg + 6) + (long)(int)~(uint)local_f8 * 4) =
               pPVar15->aTempReg[3];
        }
      }
      target = (int)local_e8;
      break;
    case 0x98:
      goto switchD_00168226_caseD_98;
    case 0x99:
      if (pExpr->pAggInfo == (AggInfo *)0x0) {
        sqlite3ErrorMsg(pParse,"misuse of aggregate: %s()",(pExpr->u).zToken);
      }
      else {
        target = pExpr->pAggInfo->aFunc[pExpr->iAgg].iMem;
      }
      break;
    case 0x9a:
      pAVar4 = pExpr->pAggInfo;
      if (pAVar4->directMode == '\0') {
        target = pAVar4->aCol[pExpr->iAgg].iMem;
        break;
      }
      if (pAVar4->useSortingIdx != '\0') {
        iVar21 = pAVar4->sortingIdxPTab;
        iVar12 = pAVar4->aCol[pExpr->iAgg].iSorterColumn;
        uVar14 = 0x1d;
        goto LAB_001681c6;
      }
      goto switchD_00168226_caseD_98;
    case 0x9c:
      pEVar18 = pExpr->pLeft;
      if (pEVar18->op == 0x82) {
        pcVar16 = (pEVar18->u).zToken;
        iVar12 = 1;
        goto LAB_00168c59;
      }
      if (pEVar18->op != 0x81) {
        if (pParse->nTempReg == '\0') {
          iVar12 = pParse->nMem + 1;
          pParse->nMem = iVar12;
        }
        else {
          bVar10 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar10;
          iVar12 = pParse->aTempReg[bVar10];
        }
        sqlite3VdbeAddOp3((Vdbe *)pPVar15,7,0,iVar12,0);
        iVar11 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree2);
        sqlite3VdbeAddOp3((Vdbe *)pPVar15,0x57,iVar11,iVar12,target);
        local_104 = iVar12;
        break;
      }
      iVar12 = 1;
      pExpr = pEVar18;
LAB_00168966:
      codeInteger(pPVar15,pExpr,iVar12,target);
      break;
    case 0x9d:
      goto switchD_00168181_caseD_18;
    default:
      if (bVar1 == 0x74) goto switchD_00168181_caseD_14;
    case 0x86:
    case 0x87:
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f:
    case 0x90:
    case 0x91:
    case 0x93:
    case 0x94:
    case 0x95:
    case 0x96:
switchD_00168181_caseD_15:
      pEVar17 = ((pExpr->x).pList)->a;
      local_f0 = CONCAT44(local_f0._4_4_,((pExpr->x).pList)->nExpr);
      iVar12 = sqlite3VdbeMakeLabel((Vdbe *)pPVar15);
      local_d0 = (sqlite3 *)CONCAT44(local_d0._4_4_,iVar12);
      local_d8 = pExpr->pLeft;
      if (local_d8 == (Expr *)0x0) {
        pEVar18 = (Expr *)0x0;
      }
      else {
        opCompare.pLeft = &cacheX;
        pEVar18 = local_d8;
        pEVar22 = opCompare.pLeft;
        for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
          cVar9 = pEVar18->affinity;
          uVar6 = pEVar18->flags;
          uVar7 = *(undefined4 *)&pEVar18->field_0x4;
          pEVar22->op = pEVar18->op;
          pEVar22->affinity = cVar9;
          pEVar22->flags = uVar6;
          *(undefined4 *)&pEVar22->field_0x4 = uVar7;
          pEVar18 = (Expr *)((long)pEVar18 + (ulong)bVar10 * -0x10 + 8);
          pEVar22 = (Expr *)((long)pEVar22 + (ulong)bVar10 * -0x10 + 8);
        }
        cacheX.iTable = sqlite3ExprCodeTemp(pParse,local_d8,&local_104);
        cacheX.op = 0x84;
        pEVar18 = &opCompare;
        opCompare.op = 'L';
        local_104 = 0;
      }
      pPVar15 = local_100;
      if (0 < (int)local_f0) {
        pEVar17 = pEVar17 + 1;
        iVar12 = 0;
        local_e8 = (ulong)(uint)target;
        local_c8 = pExpr;
        do {
          pPVar8 = local_e0;
          local_100->iCacheLevel = local_100->iCacheLevel + 1;
          pEVar22 = pEVar17[-1].pExpr;
          if (local_d8 != (Expr *)0x0) {
            pEVar22 = pEVar18;
            opCompare.pRight = pEVar17[-1].pExpr;
          }
          uVar14 = sqlite3VdbeMakeLabel((Vdbe *)local_e0);
          local_f8 = pEVar22;
          sqlite3ExprIfFalse(pPVar15,pEVar22,uVar14,8);
          sqlite3ExprCode(pPVar15,pEVar17->pExpr,(int)local_e8);
          iVar11 = 1;
          sqlite3VdbeAddOp3((Vdbe *)pPVar8,1,0,(uint)local_d0,0);
          sqlite3ExprCachePop(pPVar15,iVar11);
          if (*(long *)(pPVar8->aTempReg + 6) != 0) {
            *(int *)(*(long *)(pPVar8->aTempReg + 6) + (long)(int)~uVar14 * 4) = pPVar8->aTempReg[3]
            ;
          }
          pEVar17 = pEVar17 + 2;
          iVar12 = iVar12 + 2;
          target = (int)local_e8;
          pEVar18 = local_f8;
          pExpr = local_c8;
        } while (iVar12 < (int)local_f0);
      }
      pPVar8 = local_e0;
      pPVar15 = local_100;
      pEVar18 = pExpr->pRight;
      if (pEVar18 == (Expr *)0x0) {
        sqlite3VdbeAddOp3((Vdbe *)local_e0,10,0,target,0);
      }
      else {
        local_100->iCacheLevel = local_100->iCacheLevel + 1;
        sqlite3ExprCode(local_100,pEVar18,target);
        sqlite3ExprCachePop(pPVar15,(int)pEVar18);
        local_100 = pPVar15;
      }
      lVar19 = *(long *)(pPVar8->aTempReg + 6);
      pParse = local_100;
      if (lVar19 != 0) {
        iVar12 = pPVar8->aTempReg[3];
        uVar14 = (uint)local_d0;
LAB_00168b73:
        *(int *)(lVar19 + (long)(int)~uVar14 * 4) = iVar12;
        pParse = local_100;
      }
    }
  }
LAB_001681cf:
  if (local_104 != 0) {
    bVar10 = pParse->nTempReg;
    if ((ulong)bVar10 < 8) {
      lVar19 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar19) == local_104) {
          (&pParse->aColCache[0].tempReg)[lVar19] = '\x01';
          goto LAB_00168271;
        }
        lVar19 = lVar19 + 0x18;
      } while ((int)lVar19 != 0xf0);
      pParse->nTempReg = bVar10 + 1;
      pParse->aTempReg[bVar10] = local_104;
    }
  }
LAB_00168271:
  if (regFree2 != 0) {
    bVar10 = pParse->nTempReg;
    if ((ulong)bVar10 < 8) {
      lVar19 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar19) == regFree2) {
          (&pParse->aColCache[0].tempReg)[lVar19] = '\x01';
          return target;
        }
        lVar19 = lVar19 + 0x18;
      } while ((int)lVar19 != 0xf0);
      pParse->nTempReg = bVar10 + 1;
      pParse->aTempReg[bVar10] = regFree2;
    }
  }
  return target;
switchD_00168226_caseD_98:
  if (pExpr->iTable < 0) {
    target = (int)pExpr->iColumn + pParse->ckBase;
  }
  else {
    target = sqlite3ExprCodeGetColumn
                       (pParse,pExpr->pTab,(int)pExpr->iColumn,pExpr->iTable,target,pExpr->op2);
  }
  goto LAB_001681cf;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTarget(Parse *pParse, Expr *pExpr, int target){
  Vdbe *v = pParse->pVdbe;  /* The VM under construction */
  int op;                   /* The opcode being coded */
  int inReg = target;       /* Results stored in register inReg */
  int regFree1 = 0;         /* If non-zero free this temporary register */
  int regFree2 = 0;         /* If non-zero free this temporary register */
  int r1, r2, r3, r4;       /* Various register numbers */
  sqlite3 *db = pParse->db; /* The database connection */

  assert( target>0 && target<=pParse->nMem );
  if( v==0 ){
    assert( pParse->db->mallocFailed );
    return 0;
  }

  if( pExpr==0 ){
    op = TK_NULL;
  }else{
    op = pExpr->op;
  }
  switch( op ){
    case TK_AGG_COLUMN: {
      AggInfo *pAggInfo = pExpr->pAggInfo;
      struct AggInfo_col *pCol = &pAggInfo->aCol[pExpr->iAgg];
      if( !pAggInfo->directMode ){
        assert( pCol->iMem>0 );
        inReg = pCol->iMem;
        break;
      }else if( pAggInfo->useSortingIdx ){
        sqlite3VdbeAddOp3(v, OP_Column, pAggInfo->sortingIdxPTab,
                              pCol->iSorterColumn, target);
        break;
      }
      /* Otherwise, fall thru into the TK_COLUMN case */
    }
    case TK_COLUMN: {
      if( pExpr->iTable<0 ){
        /* This only happens when coding check constraints */
        assert( pParse->ckBase>0 );
        inReg = pExpr->iColumn + pParse->ckBase;
      }else{
        inReg = sqlite3ExprCodeGetColumn(pParse, pExpr->pTab,
                                 pExpr->iColumn, pExpr->iTable, target,
                                 pExpr->op2);
      }
      break;
    }
    case TK_INTEGER: {
      codeInteger(pParse, pExpr, 0, target);
      break;
    }
#ifndef SQLITE_OMIT_FLOATING_POINT
    case TK_FLOAT: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      codeReal(v, pExpr->u.zToken, 0, target);
      break;
    }
#endif
    case TK_STRING: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      sqlite3VdbeAddOp4(v, OP_String8, 0, target, 0, pExpr->u.zToken, 0);
      break;
    }
    case TK_NULL: {
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      break;
    }
#ifndef SQLITE_OMIT_BLOB_LITERAL
    case TK_BLOB: {
      int n;
      const char *z;
      char *zBlob;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
      assert( pExpr->u.zToken[1]=='\'' );
      z = &pExpr->u.zToken[2];
      n = sqlite3Strlen30(z) - 1;
      assert( z[n]=='\'' );
      zBlob = sqlite3HexToBlob(sqlite3VdbeDb(v), z, n);
      sqlite3VdbeAddOp4(v, OP_Blob, n/2, target, 0, zBlob, P4_DYNAMIC);
      break;
    }
#endif
    case TK_VARIABLE: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken!=0 );
      assert( pExpr->u.zToken[0]!=0 );
      sqlite3VdbeAddOp2(v, OP_Variable, pExpr->iColumn, target);
      if( pExpr->u.zToken[1]!=0 ){
        assert( pExpr->u.zToken[0]=='?' 
             || strcmp(pExpr->u.zToken, pParse->azVar[pExpr->iColumn-1])==0 );
        sqlite3VdbeChangeP4(v, -1, pParse->azVar[pExpr->iColumn-1], P4_STATIC);
      }
      break;
    }
    case TK_REGISTER: {
      inReg = pExpr->iTable;
      break;
    }
    case TK_AS: {
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      break;
    }
#ifndef SQLITE_OMIT_CAST
    case TK_CAST: {
      /* Expressions of the form:   CAST(pLeft AS token) */
      int aff, to_op;
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      aff = sqlite3AffinityType(pExpr->u.zToken);
      to_op = aff - SQLITE_AFF_TEXT + OP_ToText;
      assert( to_op==OP_ToText    || aff!=SQLITE_AFF_TEXT    );
      assert( to_op==OP_ToBlob    || aff!=SQLITE_AFF_NONE    );
      assert( to_op==OP_ToNumeric || aff!=SQLITE_AFF_NUMERIC );
      assert( to_op==OP_ToInt     || aff!=SQLITE_AFF_INTEGER );
      assert( to_op==OP_ToReal    || aff!=SQLITE_AFF_REAL    );
      testcase( to_op==OP_ToText );
      testcase( to_op==OP_ToBlob );
      testcase( to_op==OP_ToNumeric );
      testcase( to_op==OP_ToInt );
      testcase( to_op==OP_ToReal );
      if( inReg!=target ){
        sqlite3VdbeAddOp2(v, OP_SCopy, inReg, target);
        inReg = target;
      }
      sqlite3VdbeAddOp1(v, to_op, inReg);
      testcase( usedAsColumnCache(pParse, inReg, inReg) );
      sqlite3ExprCacheAffinityChange(pParse, inReg, 1);
      break;
    }
#endif /* SQLITE_OMIT_CAST */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      assert( TK_LT==OP_Lt );
      assert( TK_LE==OP_Le );
      assert( TK_GT==OP_Gt );
      assert( TK_GE==OP_Ge );
      assert( TK_EQ==OP_Eq );
      assert( TK_NE==OP_Ne );
      testcase( op==TK_LT );
      testcase( op==TK_LE );
      testcase( op==TK_GT );
      testcase( op==TK_GE );
      testcase( op==TK_EQ );
      testcase( op==TK_NE );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, inReg, SQLITE_STOREP2);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      testcase( op==TK_IS );
      testcase( op==TK_ISNOT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      op = (op==TK_IS) ? TK_EQ : TK_NE;
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, inReg, SQLITE_STOREP2 | SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_AND:
    case TK_OR:
    case TK_PLUS:
    case TK_STAR:
    case TK_MINUS:
    case TK_REM:
    case TK_BITAND:
    case TK_BITOR:
    case TK_SLASH:
    case TK_LSHIFT:
    case TK_RSHIFT: 
    case TK_CONCAT: {
      assert( TK_AND==OP_And );
      assert( TK_OR==OP_Or );
      assert( TK_PLUS==OP_Add );
      assert( TK_MINUS==OP_Subtract );
      assert( TK_REM==OP_Remainder );
      assert( TK_BITAND==OP_BitAnd );
      assert( TK_BITOR==OP_BitOr );
      assert( TK_SLASH==OP_Divide );
      assert( TK_LSHIFT==OP_ShiftLeft );
      assert( TK_RSHIFT==OP_ShiftRight );
      assert( TK_CONCAT==OP_Concat );
      testcase( op==TK_AND );
      testcase( op==TK_OR );
      testcase( op==TK_PLUS );
      testcase( op==TK_MINUS );
      testcase( op==TK_REM );
      testcase( op==TK_BITAND );
      testcase( op==TK_BITOR );
      testcase( op==TK_SLASH );
      testcase( op==TK_LSHIFT );
      testcase( op==TK_RSHIFT );
      testcase( op==TK_CONCAT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      sqlite3VdbeAddOp3(v, op, r2, r1, target);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_UMINUS: {
      Expr *pLeft = pExpr->pLeft;
      assert( pLeft );
      if( pLeft->op==TK_INTEGER ){
        codeInteger(pParse, pLeft, 1, target);
#ifndef SQLITE_OMIT_FLOATING_POINT
      }else if( pLeft->op==TK_FLOAT ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        codeReal(v, pLeft->u.zToken, 1, target);
#endif
      }else{
        regFree1 = r1 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Integer, 0, r1);
        r2 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree2);
        sqlite3VdbeAddOp3(v, OP_Subtract, r2, r1, target);
        testcase( regFree2==0 );
      }
      inReg = target;
      break;
    }
    case TK_BITNOT:
    case TK_NOT: {
      assert( TK_BITNOT==OP_BitNot );
      assert( TK_NOT==OP_Not );
      testcase( op==TK_BITNOT );
      testcase( op==TK_NOT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      inReg = target;
      sqlite3VdbeAddOp2(v, op, r1, inReg);
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      int addr;
      assert( TK_ISNULL==OP_IsNull );
      assert( TK_NOTNULL==OP_NotNull );
      testcase( op==TK_ISNULL );
      testcase( op==TK_NOTNULL );
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      addr = sqlite3VdbeAddOp1(v, op, r1);
      sqlite3VdbeAddOp2(v, OP_AddImm, target, -1);
      sqlite3VdbeJumpHere(v, addr);
      break;
    }
    case TK_AGG_FUNCTION: {
      AggInfo *pInfo = pExpr->pAggInfo;
      if( pInfo==0 ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        sqlite3ErrorMsg(pParse, "misuse of aggregate: %s()", pExpr->u.zToken);
      }else{
        inReg = pInfo->aFunc[pExpr->iAgg].iMem;
      }
      break;
    }
    case TK_CONST_FUNC:
    case TK_FUNCTION: {
      ExprList *pFarg;       /* List of function arguments */
      int nFarg;             /* Number of function arguments */
      FuncDef *pDef;         /* The function definition object */
      int nId;               /* Length of the function name in bytes */
      const char *zId;       /* The function name */
      int constMask = 0;     /* Mask of function arguments that are constant */
      int i;                 /* Loop counter */
      u8 enc = ENC(db);      /* The text encoding used by this database */
      CollSeq *pColl = 0;    /* A collating sequence */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      testcase( op==TK_CONST_FUNC );
      testcase( op==TK_FUNCTION );
      if( ExprHasAnyProperty(pExpr, EP_TokenOnly) ){
        pFarg = 0;
      }else{
        pFarg = pExpr->x.pList;
      }
      nFarg = pFarg ? pFarg->nExpr : 0;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(db, zId, nId, nFarg, enc, 0);
      if( pDef==0 ){
        sqlite3ErrorMsg(pParse, "unknown function: %.*s()", nId, zId);
        break;
      }

      /* Attempt a direct implementation of the built-in COALESCE() and
      ** IFNULL() functions.  This avoids unnecessary evalation of
      ** arguments past the first non-NULL argument.
      */
      if( pDef->flags & SQLITE_FUNC_COALESCE ){
        int endCoalesce = sqlite3VdbeMakeLabel(v);
        assert( nFarg>=2 );
        sqlite3ExprCode(pParse, pFarg->a[0].pExpr, target);
        for(i=1; i<nFarg; i++){
          sqlite3VdbeAddOp2(v, OP_NotNull, target, endCoalesce);
          sqlite3ExprCacheRemove(pParse, target, 1);
          sqlite3ExprCachePush(pParse);
          sqlite3ExprCode(pParse, pFarg->a[i].pExpr, target);
          sqlite3ExprCachePop(pParse, 1);
        }
        sqlite3VdbeResolveLabel(v, endCoalesce);
        break;
      }


      if( pFarg ){
        r1 = sqlite3GetTempRange(pParse, nFarg);

        /* For length() and typeof() functions with a column argument,
        ** set the P5 parameter to the OP_Column opcode to OPFLAG_LENGTHARG
        ** or OPFLAG_TYPEOFARG respectively, to avoid unnecessary data
        ** loading.
        */
        if( (pDef->flags & (SQLITE_FUNC_LENGTH|SQLITE_FUNC_TYPEOF))!=0 ){
          u8 exprOp;
          assert( nFarg==1 );
          assert( pFarg->a[0].pExpr!=0 );
          exprOp = pFarg->a[0].pExpr->op;
          if( exprOp==TK_COLUMN || exprOp==TK_AGG_COLUMN ){
            assert( SQLITE_FUNC_LENGTH==OPFLAG_LENGTHARG );
            assert( SQLITE_FUNC_TYPEOF==OPFLAG_TYPEOFARG );
            testcase( pDef->flags==SQLITE_FUNC_LENGTH );
            pFarg->a[0].pExpr->op2 = pDef->flags;
          }
        }

        sqlite3ExprCachePush(pParse);     /* Ticket 2ea2425d34be */
        sqlite3ExprCodeExprList(pParse, pFarg, r1, 1);
        sqlite3ExprCachePop(pParse, 1);   /* Ticket 2ea2425d34be */
      }else{
        r1 = 0;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
      /* Possibly overload the function if the first argument is
      ** a virtual table column.
      **
      ** For infix functions (LIKE, GLOB, REGEXP, and MATCH) use the
      ** second argument, not the first, as the argument to test to
      ** see if it is a column in a virtual table.  This is done because
      ** the left operand of infix functions (the operand we want to
      ** control overloading) ends up as the second argument to the
      ** function.  The expression "A glob B" is equivalent to 
      ** "glob(B,A).  We want to use the A in "A glob B" to test
      ** for function overloading.  But we use the B term in "glob(B,A)".
      */
      if( nFarg>=2 && (pExpr->flags & EP_InfixFunc) ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[1].pExpr);
      }else if( nFarg>0 ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[0].pExpr);
      }
#endif
      for(i=0; i<nFarg; i++){
        if( i<32 && sqlite3ExprIsConstant(pFarg->a[i].pExpr) ){
          constMask |= (1<<i);
        }
        if( (pDef->flags & SQLITE_FUNC_NEEDCOLL)!=0 && !pColl ){
          pColl = sqlite3ExprCollSeq(pParse, pFarg->a[i].pExpr);
        }
      }
      if( pDef->flags & SQLITE_FUNC_NEEDCOLL ){
        if( !pColl ) pColl = db->pDfltColl; 
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0, 0, 0, (char *)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp4(v, OP_Function, constMask, r1, target,
                        (char*)pDef, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u8)nFarg);
      if( nFarg ){
        sqlite3ReleaseTempRange(pParse, r1, nFarg);
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_EXISTS:
    case TK_SELECT: {
      testcase( op==TK_EXISTS );
      testcase( op==TK_SELECT );
      inReg = sqlite3CodeSubselect(pParse, pExpr, 0, 0);
      break;
    }
    case TK_IN: {
      int destIfFalse = sqlite3VdbeMakeLabel(v);
      int destIfNull = sqlite3VdbeMakeLabel(v);
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      sqlite3ExprCodeIN(pParse, pExpr, destIfFalse, destIfNull);
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      sqlite3VdbeResolveLabel(v, destIfFalse);
      sqlite3VdbeAddOp2(v, OP_AddImm, target, 0);
      sqlite3VdbeResolveLabel(v, destIfNull);
      break;
    }
#endif /* SQLITE_OMIT_SUBQUERY */


    /*
    **    x BETWEEN y AND z
    **
    ** This is equivalent to
    **
    **    x>=y AND x<=z
    **
    ** X is stored in pExpr->pLeft.
    ** Y is stored in pExpr->pList->a[0].pExpr.
    ** Z is stored in pExpr->pList->a[1].pExpr.
    */
    case TK_BETWEEN: {
      Expr *pLeft = pExpr->pLeft;
      struct ExprList_item *pLItem = pExpr->x.pList->a;
      Expr *pRight = pLItem->pExpr;

      r1 = sqlite3ExprCodeTemp(pParse, pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pRight, &regFree2);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      r3 = sqlite3GetTempReg(pParse);
      r4 = sqlite3GetTempReg(pParse);
      codeCompare(pParse, pLeft, pRight, OP_Ge,
                  r1, r2, r3, SQLITE_STOREP2);
      pLItem++;
      pRight = pLItem->pExpr;
      sqlite3ReleaseTempReg(pParse, regFree2);
      r2 = sqlite3ExprCodeTemp(pParse, pRight, &regFree2);
      testcase( regFree2==0 );
      codeCompare(pParse, pLeft, pRight, OP_Le, r1, r2, r4, SQLITE_STOREP2);
      sqlite3VdbeAddOp3(v, OP_And, r3, r4, target);
      sqlite3ReleaseTempReg(pParse, r3);
      sqlite3ReleaseTempReg(pParse, r4);
      break;
    }
    case TK_COLLATE: 
    case TK_UPLUS: {
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      break;
    }

    case TK_TRIGGER: {
      /* If the opcode is TK_TRIGGER, then the expression is a reference
      ** to a column in the new.* or old.* pseudo-tables available to
      ** trigger programs. In this case Expr.iTable is set to 1 for the
      ** new.* pseudo-table, or 0 for the old.* pseudo-table. Expr.iColumn
      ** is set to the column of the pseudo-table to read, or to -1 to
      ** read the rowid field.
      **
      ** The expression is implemented using an OP_Param opcode. The p1
      ** parameter is set to 0 for an old.rowid reference, or to (i+1)
      ** to reference another column of the old.* pseudo-table, where 
      ** i is the index of the column. For a new.rowid reference, p1 is
      ** set to (n+1), where n is the number of columns in each pseudo-table.
      ** For a reference to any other column in the new.* pseudo-table, p1
      ** is set to (n+2+i), where n and i are as defined previously. For
      ** example, if the table on which triggers are being fired is
      ** declared as:
      **
      **   CREATE TABLE t1(a, b);
      **
      ** Then p1 is interpreted as follows:
      **
      **   p1==0   ->    old.rowid     p1==3   ->    new.rowid
      **   p1==1   ->    old.a         p1==4   ->    new.a
      **   p1==2   ->    old.b         p1==5   ->    new.b       
      */
      Table *pTab = pExpr->pTab;
      int p1 = pExpr->iTable * (pTab->nCol+1) + 1 + pExpr->iColumn;

      assert( pExpr->iTable==0 || pExpr->iTable==1 );
      assert( pExpr->iColumn>=-1 && pExpr->iColumn<pTab->nCol );
      assert( pTab->iPKey<0 || pExpr->iColumn!=pTab->iPKey );
      assert( p1>=0 && p1<(pTab->nCol*2+2) );

      sqlite3VdbeAddOp2(v, OP_Param, p1, target);
      VdbeComment((v, "%s.%s -> $%d",
        (pExpr->iTable ? "new" : "old"),
        (pExpr->iColumn<0 ? "rowid" : pExpr->pTab->aCol[pExpr->iColumn].zName),
        target
      ));

#ifndef SQLITE_OMIT_FLOATING_POINT
      /* If the column has REAL affinity, it may currently be stored as an
      ** integer. Use OP_RealAffinity to make sure it is really real.  */
      if( pExpr->iColumn>=0 
       && pTab->aCol[pExpr->iColumn].affinity==SQLITE_AFF_REAL
      ){
        sqlite3VdbeAddOp1(v, OP_RealAffinity, target);
      }
#endif
      break;
    }


    /*
    ** Form A:
    **   CASE x WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form B:
    **   CASE WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form A is can be transformed into the equivalent form B as follows:
    **   CASE WHEN x=e1 THEN r1 WHEN x=e2 THEN r2 ...
    **        WHEN x=eN THEN rN ELSE y END
    **
    ** X (if it exists) is in pExpr->pLeft.
    ** Y is in pExpr->pRight.  The Y is also optional.  If there is no
    ** ELSE clause and no other term matches, then the result of the
    ** exprssion is NULL.
    ** Ei is in pExpr->pList->a[i*2] and Ri is pExpr->pList->a[i*2+1].
    **
    ** The result of the expression is the Ri for the first matching Ei,
    ** or if there is no matching Ei, the ELSE term Y, or if there is
    ** no ELSE term, NULL.
    */
    default: assert( op==TK_CASE ); {
      int endLabel;                     /* GOTO label for end of CASE stmt */
      int nextCase;                     /* GOTO label for next WHEN clause */
      int nExpr;                        /* 2x number of WHEN terms */
      int i;                            /* Loop counter */
      ExprList *pEList;                 /* List of WHEN terms */
      struct ExprList_item *aListelem;  /* Array of WHEN terms */
      Expr opCompare;                   /* The X==Ei expression */
      Expr cacheX;                      /* Cached expression X */
      Expr *pX;                         /* The X expression */
      Expr *pTest = 0;                  /* X==Ei (form A) or just Ei (form B) */
      VVA_ONLY( int iCacheLevel = pParse->iCacheLevel; )

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) && pExpr->x.pList );
      assert((pExpr->x.pList->nExpr % 2) == 0);
      assert(pExpr->x.pList->nExpr > 0);
      pEList = pExpr->x.pList;
      aListelem = pEList->a;
      nExpr = pEList->nExpr;
      endLabel = sqlite3VdbeMakeLabel(v);
      if( (pX = pExpr->pLeft)!=0 ){
        cacheX = *pX;
        testcase( pX->op==TK_COLUMN );
        testcase( pX->op==TK_REGISTER );
        cacheX.iTable = sqlite3ExprCodeTemp(pParse, pX, &regFree1);
        testcase( regFree1==0 );
        cacheX.op = TK_REGISTER;
        opCompare.op = TK_EQ;
        opCompare.pLeft = &cacheX;
        pTest = &opCompare;
        /* Ticket b351d95f9cd5ef17e9d9dbae18f5ca8611190001:
        ** The value in regFree1 might get SCopy-ed into the file result.
        ** So make sure that the regFree1 register is not reused for other
        ** purposes and possibly overwritten.  */
        regFree1 = 0;
      }
      for(i=0; i<nExpr; i=i+2){
        sqlite3ExprCachePush(pParse);
        if( pX ){
          assert( pTest!=0 );
          opCompare.pRight = aListelem[i].pExpr;
        }else{
          pTest = aListelem[i].pExpr;
        }
        nextCase = sqlite3VdbeMakeLabel(v);
        testcase( pTest->op==TK_COLUMN );
        sqlite3ExprIfFalse(pParse, pTest, nextCase, SQLITE_JUMPIFNULL);
        testcase( aListelem[i+1].pExpr->op==TK_COLUMN );
        testcase( aListelem[i+1].pExpr->op==TK_REGISTER );
        sqlite3ExprCode(pParse, aListelem[i+1].pExpr, target);
        sqlite3VdbeAddOp2(v, OP_Goto, 0, endLabel);
        sqlite3ExprCachePop(pParse, 1);
        sqlite3VdbeResolveLabel(v, nextCase);
      }
      if( pExpr->pRight ){
        sqlite3ExprCachePush(pParse);
        sqlite3ExprCode(pParse, pExpr->pRight, target);
        sqlite3ExprCachePop(pParse, 1);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      }
      assert( db->mallocFailed || pParse->nErr>0 
           || pParse->iCacheLevel==iCacheLevel );
      sqlite3VdbeResolveLabel(v, endLabel);
      break;
    }
#ifndef SQLITE_OMIT_TRIGGER
    case TK_RAISE: {
      assert( pExpr->affinity==OE_Rollback 
           || pExpr->affinity==OE_Abort
           || pExpr->affinity==OE_Fail
           || pExpr->affinity==OE_Ignore
      );
      if( !pParse->pTriggerTab ){
        sqlite3ErrorMsg(pParse,
                       "RAISE() may only be used within a trigger-program");
        return 0;
      }
      if( pExpr->affinity==OE_Abort ){
        sqlite3MayAbort(pParse);
      }
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      if( pExpr->affinity==OE_Ignore ){
        sqlite3VdbeAddOp4(
            v, OP_Halt, SQLITE_OK, OE_Ignore, 0, pExpr->u.zToken,0);
      }else{
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_TRIGGER,
                              pExpr->affinity, pExpr->u.zToken, 0);
      }

      break;
    }
#endif
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
  return inReg;
}